

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

SymOpnd * Lowerer::LoadCallInfo(Instr *instrInsert)

{
  Func *this;
  bool bVar1;
  uint32 offset;
  JITTimeFunctionBody *this_00;
  Instr *pIVar2;
  Opnd *pOVar3;
  RegOpnd *pRVar4;
  IndirOpnd *src;
  SymOpnd *dst;
  StackSym *pSVar5;
  StackSym *srcSym;
  SymOpnd *callInfoSymOpnd;
  StackSym *callInfoSym;
  Instr *instr;
  IndirOpnd *indirOpnd;
  RegOpnd *generatorRegOpnd;
  Instr *genLoadInstr;
  Func *func;
  SymOpnd *srcOpnd;
  Instr *instrInsert_local;
  
  this = instrInsert->m_func;
  this_00 = Func::GetJITFunctionBody(this);
  bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar1) {
    pIVar2 = LoadGeneratorObject(instrInsert);
    pOVar3 = IR::Instr::GetDst(pIVar2);
    pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
    offset = Js::JavascriptGenerator::GetCallInfoOffset();
    src = IR::IndirOpnd::New(pRVar4,offset,TyUint64,this,false);
    pRVar4 = IR::RegOpnd::New(TyUint64,this);
    pIVar2 = InsertMove(&pRVar4->super_Opnd,&src->super_Opnd,instrInsert,true);
    pSVar5 = StackSym::New(TyInt64,this);
    dst = IR::SymOpnd::New(&pSVar5->super_Sym,TyInt64,this);
    pOVar3 = IR::Instr::GetDst(pIVar2);
    InsertMove(&dst->super_Opnd,pOVar3,instrInsert,true);
    func = (Func *)IR::SymOpnd::New(&pSVar5->super_Sym,TyInt64,this);
  }
  else {
    pSVar5 = LowererMD::GetImplicitParamSlotSym(1,this);
    func = (Func *)IR::SymOpnd::New(&pSVar5->super_Sym,TyInt64,this);
  }
  return (SymOpnd *)func;
}

Assistant:

IR::SymOpnd *
Lowerer::LoadCallInfo(IR::Instr * instrInsert)
{
    IR::SymOpnd * srcOpnd;
    Func * func = instrInsert->m_func;

    if (func->GetJITFunctionBody()->IsCoroutine())
    {
        // Generator function arguments and ArgumentsInfo are not on the stack.  Instead they
        // are accessed off the generator object (which is prm1).
        IR::Instr *genLoadInstr = LoadGeneratorObject(instrInsert);
        IR::RegOpnd * generatorRegOpnd = genLoadInstr->GetDst()->AsRegOpnd();

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetCallInfoOffset(), TyMachPtr, func);
        IR::Instr * instr = Lowerer::InsertMove(IR::RegOpnd::New(TyMachPtr, func), indirOpnd, instrInsert);

        StackSym * callInfoSym = StackSym::New(TyMachReg, func);
        IR::SymOpnd * callInfoSymOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
        Lowerer::InsertMove(callInfoSymOpnd, instr->GetDst(), instrInsert);

        srcOpnd = IR::SymOpnd::New(callInfoSym, TyMachReg, func);
    }
    else
    {
        // Otherwise callInfo is always the "second" argument.
        // The stack looks like this:
        //
        //       script param N
        //       ...
        //       script param 1
        //       callinfo
        //       function object
        //       return addr
        // FP -> FP chain

        StackSym * srcSym = LowererMD::GetImplicitParamSlotSym(1, func);
        srcOpnd = IR::SymOpnd::New(srcSym, TyMachReg, func);
    }

    return srcOpnd;
}